

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O2

void slang::ast::SpecparamSymbol::fromSyntax
               (Scope *scope,SpecparamDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::SpecparamSymbol_*> *results)

{
  undefined1 *puVar1;
  Compilation *this;
  ExpressionSyntax *pEVar2;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  SpecparamDeclaratorSyntax *pSVar3;
  SpecparamSymbol *pSVar4;
  SourceLocation SVar5;
  SpecparamSymbol *param;
  const_iterator __begin2;
  SourceLocation loc;
  string_view local_70;
  iterator_base<const_slang::syntax::SpecparamDeclaratorSyntax_*> local_60;
  ulong local_50;
  SmallVectorBase<const_slang::ast::SpecparamSymbol_*> *local_48;
  ParentList *local_40;
  SourceLocation local_38;
  
  local_60.list = &syntax->declarators;
  local_60.index = 0;
  local_50 = (syntax->declarators).elements._M_extent._M_extent_value + 1 >> 1;
  local_48 = results;
  local_40 = local_60.list;
  for (; (local_60.list != local_40 || (local_60.index != local_50));
      local_60.index = local_60.index + 1) {
    pSVar3 = slang::syntax::SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax>::
             iterator_base<const_slang::syntax::SpecparamDeclaratorSyntax_*>::dereference(&local_60)
    ;
    local_38 = parsing::Token::location(&pSVar3->name);
    this = scope->compilation;
    local_70 = parsing::Token::valueText(&pSVar3->name);
    pSVar4 = BumpAllocator::
             emplace<slang::ast::SpecparamSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation&>
                       (&this->super_BumpAllocator,&local_70,&local_38);
    local_70._M_len = (size_t)pSVar4;
    (pSVar4->super_ValueSymbol).super_Symbol.originatingSyntax = &pSVar3->super_SyntaxNode;
    (pSVar4->super_ValueSymbol).declaredType.typeOrLink =
         (anon_union_8_2_f12d5f64_for_typeOrLink)(syntax->type).ptr;
    puVar1 = &(pSVar4->super_ValueSymbol).declaredType.field_0x3f;
    *puVar1 = *puVar1 & 0x7f;
    pEVar2 = (pSVar3->value1).ptr;
    SVar5 = parsing::Token::location(&pSVar3->equals);
    (pSVar4->super_ValueSymbol).declaredType.initializerSyntax = pEVar2;
    (pSVar4->super_ValueSymbol).declaredType.initializerLocation = SVar5;
    syntax_00._M_ptr =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    syntax_00._M_extent._M_extent_value =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
         _M_extent_value;
    Symbol::setAttributes((Symbol *)local_70._M_len,scope,syntax_00);
    SmallVectorBase<slang::ast::SpecparamSymbol_const*>::
    emplace_back<slang::ast::SpecparamSymbol_const*const&>
              ((SmallVectorBase<slang::ast::SpecparamSymbol_const*> *)local_48,
               (SpecparamSymbol **)&local_70);
    if (pSVar3->value2 != (ExpressionSyntax *)0x0) {
      *(undefined1 *)(local_70._M_len + 0x150) = 1;
    }
  }
  return;
}

Assistant:

void SpecparamSymbol::fromSyntax(const Scope& scope, const SpecparamDeclarationSyntax& syntax,
                                 SmallVectorBase<const SpecparamSymbol*>& results) {
    for (auto decl : syntax.declarators) {
        auto loc = decl->name.location();
        auto param = scope.getCompilation().emplace<SpecparamSymbol>(decl->name.valueText(), loc);
        param->setSyntax(*decl);
        param->setDeclaredType(*syntax.type);
        param->setInitializerSyntax(*decl->value1, decl->equals.location());
        param->setAttributes(scope, syntax.attributes);
        results.push_back(param);

        if (decl->value2)
            param->isPathPulse = true;
    }
}